

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTImgWindow.cpp
# Opt level: O0

bool ImGui::FilteredCfgNumber
               (char *label,char *filter,dataRefsLT idx,int v_min,int v_max,int v_step,char *format)

{
  bool bVar1;
  byte bVar2;
  undefined4 in_ECX;
  undefined4 in_EDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  undefined4 in_R9D;
  bool bRet;
  bool in_stack_ffffffffffffffcf;
  undefined7 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd7;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  bVar1 = FilteredLabel((char *)CONCAT44(in_R8D,in_R9D),
                        (char *)CONCAT17(in_stack_ffffffffffffffd7,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffcf);
  if (bVar1) {
    PushID((char *)CONCAT44(in_EDX,in_ECX));
    bVar2 = SliderDr((char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),
                     (dataRefsLT)((ulong)in_RDI >> 0x20),(int)in_RDI,(int)((ulong)in_RSI >> 0x20),
                     (int)in_RSI,(char *)CONCAT44(in_EDX,in_ECX));
    PopID();
    TableNextCell();
    bVar1 = (bool)(bVar2 & 1);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

IMGUI_API bool FilteredCfgNumber(const char* label, const char* filter, dataRefsLT idx,
                                 int v_min, int v_max, int v_step, const char* format)
{
    // Draw label first
    if (!FilteredLabel(label, filter))
        return false;

    // Next cell: Draw the checkbox with a value linked to the dataRef
    PushID(label);
    const bool bRet = SliderDr("", idx, v_min, v_max, v_step, format);
    PopID();
    TableNextCell();
    return bRet;
}